

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRProgram.cc
# Opt level: O0

ConstantValue<flow::util::RegExp,_(flow::LiteralType)7> * __thiscall
flow::IRProgram::
get<flow::ConstantValue<flow::util::RegExp,(flow::LiteralType)7>,flow::util::RegExp>
          (IRProgram *this,
          vector<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>_>_>
          *table,RegExp *literal)

{
  RegExp *this_00;
  bool bVar1;
  reference pvVar2;
  pointer pCVar3;
  undefined1 local_90 [88];
  size_type local_38;
  size_t e;
  size_t i;
  RegExp *literal_local;
  vector<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>_>_>
  *table_local;
  IRProgram *this_local;
  
  e = 0;
  i = (size_t)literal;
  literal_local = (RegExp *)table;
  table_local = (vector<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>_>_>
                 *)this;
  local_38 = std::
             vector<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>_>_>
             ::size(table);
  while( true ) {
    this_00 = literal_local;
    if (e == local_38) {
      std::
      make_unique<flow::ConstantValue<flow::util::RegExp,(flow::LiteralType)7>,flow::util::RegExp_const&>
                ((RegExp *)local_90);
      std::
      vector<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,(flow::LiteralType)7>,std::default_delete<flow::ConstantValue<flow::util::RegExp,(flow::LiteralType)7>>>,std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,(flow::LiteralType)7>,std::default_delete<flow::ConstantValue<flow::util::RegExp,(flow::LiteralType)7>>>>>
      ::
      emplace_back<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,(flow::LiteralType)7>,std::default_delete<flow::ConstantValue<flow::util::RegExp,(flow::LiteralType)7>>>>
                ((vector<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,(flow::LiteralType)7>,std::default_delete<flow::ConstantValue<flow::util::RegExp,(flow::LiteralType)7>>>,std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,(flow::LiteralType)7>,std::default_delete<flow::ConstantValue<flow::util::RegExp,(flow::LiteralType)7>>>>>
                  *)this_00,
                 (unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>
                  *)local_90);
      std::
      unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>
      ::~unique_ptr((unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>
                     *)local_90);
      pvVar2 = std::
               vector<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>_>_>
               ::back((vector<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>_>_>
                       *)literal_local);
      pCVar3 = std::
               unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>
               ::get(pvVar2);
      return pCVar3;
    }
    pvVar2 = std::
             vector<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>_>_>
             ::operator[]((vector<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>_>_>
                           *)literal_local,e);
    pCVar3 = std::
             unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>
             ::operator->(pvVar2);
    ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>::get((RegExp *)(local_90 + 0x18),pCVar3)
    ;
    bVar1 = util::operator==((RegExp *)(local_90 + 0x18),(RegExp *)i);
    util::RegExp::~RegExp((RegExp *)(local_90 + 0x18));
    if (bVar1) break;
    e = e + 1;
  }
  pvVar2 = std::
           vector<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>_>_>
           ::operator[]((vector<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>_>_>
                         *)literal_local,e);
  pCVar3 = std::
           unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>
           ::get(pvVar2);
  return pCVar3;
}

Assistant:

T* IRProgram::get(std::vector<std::unique_ptr<T>>& table, const U& literal) {
  for (size_t i = 0, e = table.size(); i != e; ++i)
    if (table[i]->get() == literal)
      return table[i].get();

  table.emplace_back(std::make_unique<T>(literal));
  return table.back().get();
}